

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

void __thiscall
ktx::CommandCreate::determineTargetOrigin
          (CommandCreate *this,ImageInput *in,ImageSpec *target,Origin *usedSourceOrigin)

{
  undefined2 uVar1;
  uint8_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((this->options).super_OptionsCreate.assignTexcoordOrigin.
      super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
      super__Optional_payload_base<ImageSpec::Origin>._M_engaged == true) {
    usedSourceOrigin->z =
         (this->options).super_OptionsCreate.assignTexcoordOrigin.
         super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
         super__Optional_payload_base<ImageSpec::Origin>._M_payload._M_value.z;
    uVar1 = *(undefined2 *)
             &(this->options).super_OptionsCreate.assignTexcoordOrigin.
              super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
              super__Optional_payload_base<ImageSpec::Origin>._M_payload;
    usedSourceOrigin->x = (char)uVar1;
    usedSourceOrigin->y = (char)((ushort)uVar1 >> 8);
  }
  else {
    iVar3 = (*in->_vptr_ImageInput[0xe])(in);
    uVar1 = *(undefined2 *)(CONCAT44(extraout_var,iVar3) + 0x7c);
    usedSourceOrigin->x = (char)uVar1;
    usedSourceOrigin->y = (char)((ushort)uVar1 >> 8);
    usedSourceOrigin->z = *(uint8_t *)(CONCAT44(extraout_var,iVar3) + 0x7e);
  }
  (target->imageOrigin).z = usedSourceOrigin->z;
  uVar2 = usedSourceOrigin->y;
  (target->imageOrigin).x = usedSourceOrigin->x;
  (target->imageOrigin).y = uVar2;
  if ((this->options).super_OptionsCreate.convertTexcoordOrigin.
      super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
      super__Optional_payload_base<ImageSpec::Origin>._M_engaged != true) {
    return;
  }
  if (((usedSourceOrigin->x == 0xff) || (usedSourceOrigin->y == 0xff)) ||
     (usedSourceOrigin->z == 0xff)) {
    iVar3 = (*in->_vptr_ImageInput[0xd])(in);
    Reporter::fatal<char_const(&)[128],std::__cxx11::string_const&,char_const*&>
              (&(this->super_Command).super_Reporter,INVALID_FILE,
               (char (*) [128])
               "Cannot convert texcoord origin as no information about the origin is available in the input file \"{}\". Use --{} to specify one."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var_00,iVar3),&OptionsCreate::kAssignTexcoordOrigin);
    return;
  }
  if ((((this->options).super_OptionsCreate.convertTexcoordOrigin.
        super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
        super__Optional_payload_base<ImageSpec::Origin>._M_payload._M_value.x == usedSourceOrigin->x
       ) && ((this->options).super_OptionsCreate.convertTexcoordOrigin.
             super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
             super__Optional_payload_base<ImageSpec::Origin>._M_payload._M_value.y ==
             usedSourceOrigin->y)) &&
     ((this->options).super_OptionsCreate.convertTexcoordOrigin.
      super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
      super__Optional_payload_base<ImageSpec::Origin>._M_payload._M_value.z == usedSourceOrigin->z))
  {
    return;
  }
  (target->imageOrigin).z =
       (this->options).super_OptionsCreate.convertTexcoordOrigin.
       super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
       super__Optional_payload_base<ImageSpec::Origin>._M_payload._M_value.z;
  uVar1 = *(undefined2 *)
           &(this->options).super_OptionsCreate.convertTexcoordOrigin.
            super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
            super__Optional_payload_base<ImageSpec::Origin>._M_payload;
  (target->imageOrigin).x = (char)uVar1;
  (target->imageOrigin).y = (char)((ushort)uVar1 >> 8);
  return;
}

Assistant:

void CommandCreate::determineTargetOrigin(const ImageInput& in, ImageSpec& target,
                                          ImageSpec::Origin& usedSourceOrigin) {
    determineSourceOrigin(in, usedSourceOrigin);
    target.setOrigin(usedSourceOrigin);

    if (options.convertTexcoordOrigin.has_value()) {
        if (usedSourceOrigin.unspecified()) {
            fatal(rc::INVALID_FILE, "Cannot convert texcoord origin as no information about the origin "
                "is available in the input file \"{}\". Use --{} to specify one.",
                in.filename(), OptionsCreate::kAssignTexcoordOrigin);
        } else if (options.convertTexcoordOrigin.value() != usedSourceOrigin) {
            target.setOrigin(options.convertTexcoordOrigin.value());
        }
    }
}